

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rshapes.c
# Opt level: O1

void DrawEllipseLines(int centerX,int centerY,float radiusH,float radiusV,Color color)

{
  uint uVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  
  rlBegin(1);
  uVar2 = 0xfffffff6;
  do {
    uVar1 = uVar2 + 10;
    rlColor4ub(color.r,color.g,color.b,color.a);
    fVar4 = (float)(int)(uVar2 + 0x14) * 0.017453292;
    fVar3 = cosf(fVar4);
    fVar4 = sinf(fVar4);
    rlVertex2f(fVar3 * radiusH + (float)centerX,fVar4 * radiusV + (float)centerY);
    fVar3 = cosf((float)(int)uVar1 * 0.017453292);
    fVar4 = sinf((float)(int)uVar1 * 0.017453292);
    rlVertex2f(fVar3 * radiusH + (float)centerX,fVar4 * radiusV + (float)centerY);
    uVar2 = uVar1;
  } while (uVar1 < 0x15e);
  rlEnd();
  return;
}

Assistant:

void DrawEllipseLines(int centerX, int centerY, float radiusH, float radiusV, Color color)
{
    rlBegin(RL_LINES);
        for (int i = 0; i < 360; i += 10)
        {
            rlColor4ub(color.r, color.g, color.b, color.a);
            rlVertex2f(centerX + cosf(DEG2RAD*(i + 10))*radiusH, centerY + sinf(DEG2RAD*(i + 10))*radiusV);
            rlVertex2f(centerX + cosf(DEG2RAD*i)*radiusH, centerY + sinf(DEG2RAD*i)*radiusV);
        }
    rlEnd();
}